

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O0

void __thiscall senjo::UCIAdapter::GoCommand(UCIAdapter *this,char *params)

{
  bool bVar1;
  uint uVar2;
  GoCommandHandle *this_00;
  Output *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [32];
  Output local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  Output local_40;
  Output local_38 [3];
  GoCommandHandle *local_20;
  GoCommandHandle *handle;
  char *params_local;
  UCIAdapter *this_local;
  
  handle = (GoCommandHandle *)params;
  params_local = (char *)this;
  this_00 = (GoCommandHandle *)operator_new(0x50);
  GoCommandHandle::GoCommandHandle(this_00,this->engine);
  local_20 = this_00;
  if (this_00 == (GoCommandHandle *)0x0) {
    Output::Output(local_38,InfoPrefix);
    Output::operator<<(local_38,(char (*) [14])"Out of memory");
    Output::~Output(local_38);
  }
  else {
    bVar1 = ParamMatch((string *)token::Help_abi_cxx11_,(char **)&handle);
    if (bVar1) {
      Output::Output(&local_40,InfoPrefix);
      this_01 = Output::operator<<(&local_40,(char (*) [8])"usage: ");
      (*(local_20->super_BackgroundCommand)._vptr_BackgroundCommand[3])(local_60);
      Output::operator<<(this_01,local_60);
      std::__cxx11::string::~string((string *)local_60);
      Output::~Output(&local_40);
      Output::Output(&local_68,InfoPrefix);
      (*(local_20->super_BackgroundCommand)._vptr_BackgroundCommand[4])(local_88);
      Output::operator<<(&local_68,local_88);
      std::__cxx11::string::~string((string *)local_88);
      Output::~Output(&local_68);
    }
    else {
      uVar2 = (*(local_20->super_BackgroundCommand)._vptr_BackgroundCommand[2])
                        (local_20,handle,&this->thread);
      if ((uVar2 & 1) != 0) {
        return;
      }
    }
    if (local_20 != (GoCommandHandle *)0x0) {
      (*(local_20->super_BackgroundCommand)._vptr_BackgroundCommand[1])();
    }
  }
  return;
}

Assistant:

void UCIAdapter::GoCommand(const char* params)
{
  GoCommandHandle* handle = new GoCommandHandle(engine);
  if (!handle) {
    Output() << "Out of memory";
    return;
  }

  if (ParamMatch(token::Help, params)) {
    Output() << "usage: " << handle->Usage();
    Output() << handle->Description();
  }
  else if (handle->ParseAndExecute(params, thread)) {
    return;
  }

  delete handle;
  handle = NULL;
}